

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h2-proxy.c
# Opt level: O0

void h2_tunnel_go_state(Curl_cfilter *cf,tunnel_stream *ts,h2_tunnel_state new_state,Curl_easy *data
                       )

{
  Curl_easy *data_local;
  h2_tunnel_state new_state_local;
  tunnel_stream *ts_local;
  Curl_cfilter *cf_local;
  
  if (ts->state != new_state) {
    if (ts->state == H2_TUNNEL_CONNECT) {
      *(ushort *)&(data->req).field_0xbb = *(ushort *)&(data->req).field_0xbb & 0xffdf;
    }
    switch(new_state) {
    case H2_TUNNEL_INIT:
      if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) &&
         ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
        Curl_trc_cf_infof(data,cf,"[%d] new tunnel state \'init\'",(ulong)(uint)ts->stream_id);
      }
      tunnel_stream_clear(ts);
      break;
    case H2_TUNNEL_CONNECT:
      if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) &&
         ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
        Curl_trc_cf_infof(data,cf,"[%d] new tunnel state \'connect\'",(ulong)(uint)ts->stream_id);
      }
      ts->state = H2_TUNNEL_CONNECT;
      break;
    case H2_TUNNEL_RESPONSE:
      if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0))
          && (cf != (Curl_cfilter *)0x0)) && (0 < cf->cft->log_level)) {
        Curl_trc_cf_infof(data,cf,"[%d] new tunnel state \'response\'",(ulong)(uint)ts->stream_id);
      }
      ts->state = H2_TUNNEL_RESPONSE;
      break;
    case H2_TUNNEL_ESTABLISHED:
      if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0))
          && (cf != (Curl_cfilter *)0x0)) && (0 < cf->cft->log_level)) {
        Curl_trc_cf_infof(data,cf,"[%d] new tunnel state \'established\'",(ulong)(uint)ts->stream_id
                         );
      }
      if ((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) {
        Curl_infof(data,"CONNECT phase completed");
      }
      (data->state).authproxy.field_0x18 = (data->state).authproxy.field_0x18 & 0xfe | 1;
      (data->state).authproxy.field_0x18 = (data->state).authproxy.field_0x18 & 0xfd;
    case H2_TUNNEL_FAILED:
      if (((new_state == H2_TUNNEL_FAILED) && (data != (Curl_easy *)0x0)) &&
         (((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0 &&
          ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))))) {
        Curl_trc_cf_infof(data,cf,"[%d] new tunnel state \'failed\'",(ulong)(uint)ts->stream_id);
      }
      ts->state = new_state;
      (*Curl_cfree)((data->state).aptr.proxyuserpwd);
      (data->state).aptr.proxyuserpwd = (char *)0x0;
    }
  }
  return;
}

Assistant:

static void h2_tunnel_go_state(struct Curl_cfilter *cf,
                               struct tunnel_stream *ts,
                               h2_tunnel_state new_state,
                               struct Curl_easy *data)
{
  (void)cf;

  if(ts->state == new_state)
    return;
  /* leaving this one */
  switch(ts->state) {
  case H2_TUNNEL_CONNECT:
    data->req.ignorebody = FALSE;
    break;
  default:
    break;
  }
  /* entering this one */
  switch(new_state) {
  case H2_TUNNEL_INIT:
    CURL_TRC_CF(data, cf, "[%d] new tunnel state 'init'", ts->stream_id);
    tunnel_stream_clear(ts);
    break;

  case H2_TUNNEL_CONNECT:
    CURL_TRC_CF(data, cf, "[%d] new tunnel state 'connect'", ts->stream_id);
    ts->state = H2_TUNNEL_CONNECT;
    break;

  case H2_TUNNEL_RESPONSE:
    CURL_TRC_CF(data, cf, "[%d] new tunnel state 'response'", ts->stream_id);
    ts->state = H2_TUNNEL_RESPONSE;
    break;

  case H2_TUNNEL_ESTABLISHED:
    CURL_TRC_CF(data, cf, "[%d] new tunnel state 'established'",
                ts->stream_id);
    infof(data, "CONNECT phase completed");
    data->state.authproxy.done = TRUE;
    data->state.authproxy.multipass = FALSE;
    FALLTHROUGH();
  case H2_TUNNEL_FAILED:
    if(new_state == H2_TUNNEL_FAILED)
      CURL_TRC_CF(data, cf, "[%d] new tunnel state 'failed'", ts->stream_id);
    ts->state = new_state;
    /* If a proxy-authorization header was used for the proxy, then we should
       make sure that it isn't accidentally used for the document request
       after we've connected. So let's free and clear it here. */
    Curl_safefree(data->state.aptr.proxyuserpwd);
    break;
  }
}